

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-backend-ops.cpp
# Opt level: O3

ggml_tensor * __thiscall test_gla::build_graph(test_gla *this,ggml_context *ctx)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  ggml_type gVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  ggml_tensor *pgVar14;
  long lVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  initializer_list<long> __l;
  initializer_list<long> __l_00;
  initializer_list<long> __l_01;
  initializer_list<long> __l_02;
  initializer_list<long> __l_03;
  allocator_type local_69;
  vector<long,_std::allocator<long>_> local_68;
  undefined8 local_50;
  undefined1 local_48 [16];
  long local_38;
  undefined8 extraout_XMM0_Qb;
  
  lVar15 = this->n_seqs * this->n_seq_tokens;
  gVar9 = this->type;
  uVar1 = this->head_count;
  uVar5 = this->head_size;
  local_48._8_4_ = (int)uVar1;
  local_48._0_8_ = uVar5;
  local_48._12_4_ = (int)((ulong)uVar1 >> 0x20);
  __l._M_len = 3;
  __l._M_array = (iterator)local_48;
  local_38 = lVar15;
  std::vector<long,_std::allocator<long>_>::vector(&local_68,__l,&local_69);
  uVar10 = ggml_new_tensor(ctx,gVar9,3,
                           local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                           super__Vector_impl_data._M_start);
  test_case::add_sentinel(&this->super_test_case,ctx);
  if (local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  gVar9 = this->type;
  uVar2 = this->head_count;
  uVar6 = this->head_size;
  local_48._8_4_ = (int)uVar2;
  local_48._0_8_ = uVar6;
  local_48._12_4_ = (int)((ulong)uVar2 >> 0x20);
  __l_00._M_len = 3;
  __l_00._M_array = (iterator)local_48;
  local_38 = lVar15;
  std::vector<long,_std::allocator<long>_>::vector(&local_68,__l_00,&local_69);
  uVar11 = ggml_new_tensor(ctx,gVar9,3,
                           local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                           super__Vector_impl_data._M_start);
  test_case::add_sentinel(&this->super_test_case,ctx);
  if (local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  gVar9 = this->type;
  uVar3 = this->head_count;
  uVar7 = this->head_size;
  local_48._8_4_ = (int)uVar3;
  local_48._0_8_ = uVar7;
  local_48._12_4_ = (int)((ulong)uVar3 >> 0x20);
  __l_01._M_len = 3;
  __l_01._M_array = (iterator)local_48;
  local_50 = uVar11;
  local_38 = lVar15;
  std::vector<long,_std::allocator<long>_>::vector(&local_68,__l_01,&local_69);
  uVar11 = ggml_new_tensor(ctx,gVar9,3,
                           local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                           super__Vector_impl_data._M_start);
  test_case::add_sentinel(&this->super_test_case,ctx);
  if (local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  gVar9 = this->type;
  uVar4 = this->head_count;
  uVar8 = this->head_size;
  local_48._8_4_ = (int)uVar4;
  local_48._0_8_ = uVar8;
  local_48._12_4_ = (int)((ulong)uVar4 >> 0x20);
  __l_02._M_len = 3;
  __l_02._M_array = (iterator)local_48;
  local_38 = lVar15;
  std::vector<long,_std::allocator<long>_>::vector(&local_68,__l_02,&local_69);
  uVar12 = ggml_new_tensor(ctx,gVar9,3,
                           local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                           super__Vector_impl_data._M_start);
  test_case::add_sentinel(&this->super_test_case,ctx);
  if (local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  gVar9 = this->type;
  local_48._8_8_ = this->n_seqs;
  local_48._0_8_ = this->head_size * this->head_size * this->head_count;
  __l_03._M_len = 2;
  __l_03._M_array = (iterator)local_48;
  std::vector<long,_std::allocator<long>_>::vector(&local_68,__l_03,&local_69);
  uVar13 = ggml_new_tensor(ctx,gVar9,2,
                           local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                           super__Vector_impl_data._M_start);
  test_case::add_sentinel(&this->super_test_case,ctx);
  if (local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  auVar16._0_8_ = pow((double)this->head_size,-0.5);
  auVar16._8_8_ = extraout_XMM0_Qb;
  auVar17._4_12_ = auVar16._4_12_;
  auVar17._0_4_ = (float)auVar16._0_8_;
  pgVar14 = (ggml_tensor *)
            ggml_gated_linear_attn(auVar17._0_8_,ctx,local_50,uVar11,uVar10,uVar12,uVar13);
  return pgVar14;
}

Assistant:

ggml_tensor * build_graph(ggml_context * ctx) override {
        const int64_t n_tokens = n_seq_tokens * n_seqs;
        ggml_tensor * q   = ggml_new_tensor(ctx, type, 3, std::vector<int64_t>{ head_size, head_count, n_tokens }.data());
        ggml_tensor * k   = ggml_new_tensor(ctx, type, 3, std::vector<int64_t>{ head_size, head_count, n_tokens }.data());
        ggml_tensor * v   = ggml_new_tensor(ctx, type, 3, std::vector<int64_t>{ head_size, head_count, n_tokens }.data());
        ggml_tensor * g   = ggml_new_tensor(ctx, type, 3, std::vector<int64_t>{ head_size, head_count, n_tokens }.data());
        ggml_tensor * s   = ggml_new_tensor(ctx, type, 2, std::vector<int64_t>{ head_size * head_size * head_count, n_seqs }.data());
        ggml_tensor * out = ggml_gated_linear_attn(ctx, k, v, q, g, s, pow(head_size, -0.5));
        return out;
    }